

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_scalar_product_of_persistence_vectors.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  pointer pVVar4;
  size_type sVar5;
  long lVar6;
  size_type __n;
  pointer pVVar7;
  size_t j;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  allocator_type local_299;
  long local_298;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  scalar_product;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
  vectors;
  value_type_conflict1 local_240;
  ofstream out;
  
  uVar12 = (ulong)(uint)argc;
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program computes scalar product of persistence vectors stored in a file (the file needs to "
                          );
  poVar3 = std::operator<<(poVar3,"be created beforehand). \n");
  std::operator<<(poVar3,
                  "The parameters of this programs are names of files with persistence vectors.\n");
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,
                    "Wrong number of parameters, the program will now terminate \n");
    iVar2 = 1;
  }
  else {
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      uVar12 = uVar12 - 1;
      argv = argv + 1;
      if (uVar12 == 0) break;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&filenames,argv);
    }
    vectors.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vectors.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vectors.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::reserve(&vectors,(long)filenames.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)filenames.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3);
    for (sVar5 = 0;
        sVar5 != (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3; sVar5 = sVar5 + 1) {
      _out = (pointer)0x0;
      Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
      load_from_file((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)&out,
                     filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar5]);
      std::
      vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
      ::push_back(&vectors,(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)&out);
      Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
      ~Vector_distances_in_diagram((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)&out);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&scalar_product,sVar5,(allocator_type *)&out);
    lVar8 = 0;
    for (sVar5 = 0;
        __n = (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3, sVar5 != __n; sVar5 = sVar5 + 1)
    {
      local_240 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&out,__n,&local_240,&local_299);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((scalar_product.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar8),
                 (vector<double,_std::allocator<double>_> *)&out);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&out);
      lVar8 = lVar8 + 0x18;
    }
    lVar11 = 0;
    lVar10 = 0;
    pVVar4 = vectors.
             super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = vectors.
             super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; lVar6 = lVar10, lVar9 = lVar8, local_298 = lVar11,
        lVar8 != ((long)pVVar4 - (long)pVVar7) / 0x48; lVar8 = lVar8 + 1) {
      for (; lVar9 != ((long)pVVar4 - (long)pVVar7) / 0x48; lVar9 = lVar9 + 1) {
        dVar1 = Gudhi::Persistence_representations::
                Vector_distances_in_diagram<Gudhi::Euclidean_distance>::compute_scalar_product
                          (pVVar7 + lVar8,
                           (Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)
                           ((long)&(pVVar7->intervals).
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11));
        *(double *)
         (*(long *)((long)&((scalar_product.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar6) + lVar8 * 8) = dVar1;
        scalar_product.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar9] = dVar1;
        lVar6 = lVar6 + 0x18;
        lVar11 = lVar11 + 0x48;
        pVVar4 = vectors.
                 super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pVVar7 = vectors.
                 super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar10 = lVar10 + 0x18;
      lVar11 = local_298 + 0x48;
    }
    std::ofstream::ofstream(&out);
    std::ofstream::open((char *)&out,0x1041e0);
    lVar8 = 0;
    while( true ) {
      if (lVar8 == ((long)scalar_product.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)scalar_product.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) break;
      local_298 = lVar8;
      for (lVar10 = 0;
          lVar10 != ((long)scalar_product.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scalar_product.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar10 = lVar10 + 1) {
        poVar3 = std::ostream::_M_insert<double>
                           (scalar_product.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10]);
        std::operator<<(poVar3," ");
        poVar3 = std::ostream::_M_insert<double>
                           (scalar_product.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10]);
        std::operator<<(poVar3," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
      std::endl<char,std::char_traits<char>>((ostream *)&out);
      lVar8 = local_298 + 1;
    }
    std::ofstream::close();
    std::operator<<((ostream *)&std::clog,"Distance can be found in \'scalar_product.vect\' file\n")
    ;
    std::ofstream::~ofstream(&out);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&scalar_product);
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::~vector(&vectors);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes scalar product of persistence vectors stored in a file (the file needs to "
            << "be created beforehand). \n"
            << "The parameters of this programs are names of files with persistence vectors.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  std::vector<const char*> filenames;
  for (int i = 1; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Vector_distances_in_diagram> vectors;
  vectors.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Vector_distances_in_diagram l;
    l.load_from_file(filenames[file_no]);
    vectors.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > scalar_product(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    scalar_product[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != vectors.size(); ++i) {
    for (size_t j = i; j != vectors.size(); ++j) {
      scalar_product[i][j] = scalar_product[j][i] = vectors[i].compute_scalar_product(vectors[j]);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("scalar_product.vect");
  for (size_t i = 0; i != scalar_product.size(); ++i) {
    for (size_t j = 0; j != scalar_product.size(); ++j) {
      std::clog << scalar_product[i][j] << " ";
      out << scalar_product[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'scalar_product.vect' file\n";
  return 0;
}